

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O2

bool __thiscall Bipartition::contains(Bipartition *this,Bipartition *e)

{
  bool bVar1;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> foreign;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> dStack_38;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&dStack_38,&e->partition);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
            (&dStack_38,&this->partition);
  bVar1 = boost::operator==(&dStack_38,&e->partition);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&dStack_38);
  return bVar1;
}

Assistant:

bool Bipartition::contains(const Bipartition& e) const {
    auto foreign = e.partition;
    foreign &= partition;
    return foreign == e.partition;
}